

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t archive_strncat_l(archive_string *as,void *_p,size_t n,archive_string_conv *sc)

{
  wchar_t wVar1;
  wchar_t wVar2;
  size_t s;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  int *piVar6;
  archive_string *paVar7;
  long lVar8;
  bool bVar9;
  
  if (n == 0 || _p == (void *)0x0) {
LAB_001565e5:
    if (sc == (archive_string_conv *)0x0) {
      lVar8 = 1;
      bVar9 = false;
    }
    else {
      wVar2 = sc->flag;
LAB_001565ee:
      bVar9 = (wVar2 & 0x1400U) != 0;
      lVar8 = (ulong)bVar9 + 1;
    }
    paVar7 = archive_string_ensure(as,lVar8 + as->length);
    if (paVar7 == (archive_string *)0x0) {
      wVar2 = L'\xffffffff';
    }
    else {
      as->s[as->length] = '\0';
      wVar2 = L'\0';
      if (bVar9) {
        as->s[as->length + 1] = '\0';
      }
    }
  }
  else {
    if ((sc == (archive_string_conv *)0x0) || (wVar2 = sc->flag, (wVar2 & 0x2800U) == 0)) {
      sVar5 = 0;
      do {
        if (*(char *)((long)_p + sVar5) == '\0') goto LAB_001565dd;
        sVar5 = sVar5 + 1;
      } while (n != sVar5);
    }
    else {
      if (n < 2) goto LAB_001565ee;
      uVar3 = 0;
      do {
        if ((*(char *)((long)_p + uVar3 * 2) == '\0') &&
           (uVar4 = uVar3, *(char *)((long)_p + uVar3 * 2 + 1) == '\0')) break;
        uVar3 = uVar3 + 1;
        uVar4 = n >> 1;
      } while (n >> 1 != uVar3);
      sVar5 = uVar4 * 2;
LAB_001565dd:
      n = sVar5;
      if (sVar5 == 0) goto LAB_001565e5;
    }
    if (sc == (archive_string_conv *)0x0) {
      paVar7 = archive_string_append(as,(char *)_p,n);
      wVar2 = -(uint)(paVar7 == (archive_string *)0x0);
    }
    else {
      if (sc->nconverter < L'\x02') {
        lVar8 = 0;
        wVar1 = L'\0';
      }
      else {
        (sc->utftmp).length = 0;
        wVar1 = (*sc->converter[0])(&sc->utftmp,_p,n,sc);
        if ((wVar1 != L'\0') && (piVar6 = __errno_location(), *piVar6 == 0xc)) {
          return wVar1;
        }
        wVar1 = wVar1 >> 0x1f & wVar1;
        _p = (sc->utftmp).s;
        n = (sc->utftmp).length;
        lVar8 = 1;
      }
      wVar2 = (*sc->converter[lVar8])(as,_p,n,sc);
      if (wVar1 < wVar2) {
        wVar2 = wVar1;
      }
    }
  }
  return wVar2;
}

Assistant:

int
archive_strncat_l(struct archive_string *as, const void *_p, size_t n,
    struct archive_string_conv *sc)
{
	const void *s;
	size_t length = 0;
	int i, r = 0, r2;

	if (_p != NULL && n > 0) {
		if (sc != NULL && (sc->flag & SCONV_FROM_UTF16))
			length = utf16nbytes(_p, n);
		else
			length = mbsnbytes(_p, n);
	}

	/* We must allocate memory even if there is no data for conversion
	 * or copy. This simulates archive_string_append behavior. */
	if (length == 0) {
		int tn = 1;
		if (sc != NULL && (sc->flag & SCONV_TO_UTF16))
			tn = 2;
		if (archive_string_ensure(as, as->length + tn) == NULL)
			return (-1);
		as->s[as->length] = 0;
		if (tn == 2)
			as->s[as->length+1] = 0;
		return (0);
	}

	/*
	 * If sc is NULL, we just make a copy.
	 */
	if (sc == NULL) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (0);
	}

	s = _p;
	i = 0;
	if (sc->nconverter > 1) {
		sc->utftmp.length = 0;
		r2 = sc->converter[0](&(sc->utftmp), s, length, sc);
		if (r2 != 0 && errno == ENOMEM)
			return (r2);
		if (r > r2)
			r = r2;
		s = sc->utftmp.s;
		length = sc->utftmp.length;
		++i;
	}
	r2 = sc->converter[i](as, s, length, sc);
	if (r > r2)
		r = r2;
	return (r);
}